

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O3

int lys_type_dup(lys_module *mod,lys_node *parent,lys_type *new,lys_type *old,int in_grp,int shallow
                ,unres_schema *unres)

{
  uint8_t size;
  int iVar1;
  int iVar2;
  lys_tpdf *plVar3;
  
  new->base = old->base;
  new->der = old->der;
  new->parent = (lys_tpdf *)parent;
  size = old->ext_size;
  new->ext_size = size;
  iVar1 = lys_ext_dup(mod->ctx,mod,old->ext,size,new,LYEXT_PAR_TYPE,&new->ext,shallow,unres);
  iVar2 = -1;
  if (iVar1 == 0) {
    iVar1 = unres_schema_find(unres,-1,old,UNRES_TYPE_DER);
    if (iVar1 == -1) {
      iVar2 = type_dup(mod,parent,new,old,new->base,in_grp,shallow,unres);
    }
    else {
      plVar3 = old->der;
      if (*(char *)&plVar3->name < '\0') {
        plVar3 = (lys_tpdf *)
                 lys_yang_type_dup(mod,parent,(yang_type *)plVar3,new,in_grp,shallow,unres);
      }
      else {
        plVar3 = (lys_tpdf *)lyxml_dup_elem(mod->ctx,(lyxml_elem *)plVar3,(lyxml_elem *)0x0,1,0);
      }
      new->der = plVar3;
      if (plVar3 == (lys_tpdf *)0x0) {
        iVar2 = -1;
      }
      else {
        iVar1 = unres_schema_add_node(mod,unres,new,UNRES_TYPE_DER,parent);
        iVar2 = -(uint)(iVar1 == -1);
      }
    }
  }
  return iVar2;
}

Assistant:

static int
lys_type_dup(struct lys_module *mod, struct lys_node *parent, struct lys_type *new, struct lys_type *old,
            int in_grp, int shallow, struct unres_schema *unres)
{
    int i;

    new->base = old->base;
    new->der = old->der;
    new->parent = (struct lys_tpdf *)parent;
    new->ext_size = old->ext_size;
    if (lys_ext_dup(mod->ctx, mod, old->ext, old->ext_size, new, LYEXT_PAR_TYPE, &new->ext, shallow, unres)) {
        return -1;
    }

    i = unres_schema_find(unres, -1, old, UNRES_TYPE_DER);
    if (i != -1) {
        /* HACK (serious one) for unres */
        /* nothing else we can do but duplicate it immediately */
        if (((struct lyxml_elem *)old->der)->flags & LY_YANG_STRUCTURE_FLAG) {
            new->der = (struct lys_tpdf *)lys_yang_type_dup(mod, parent, (struct yang_type *)old->der, new, in_grp,
                                                            shallow, unres);
        } else {
            new->der = (struct lys_tpdf *)lyxml_dup_elem(mod->ctx, (struct lyxml_elem *)old->der, NULL, 1, 0);
        }
        /* all these unres additions can fail even though they did not before */
        if (!new->der || (unres_schema_add_node(mod, unres, new, UNRES_TYPE_DER, parent) == -1)) {
            return -1;
        }
        return EXIT_SUCCESS;
    }

    return type_dup(mod, parent, new, old, new->base, in_grp, shallow, unres);
}